

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CMU462::Vertex::getAxes
          (Vertex *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  _List_node_base *p_Var1;
  double dVar2;
  pointer pVVar3;
  _List_node_base *p_Var4;
  Vector3D *pVVar5;
  double dVar6;
  _List_node_base *p_Var7;
  undefined1 local_38 [16];
  double local_28;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal((Vector3D *)local_38,this);
  pVVar3 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3[2].z = local_28;
  pVVar3[2].x = (double)local_38._0_8_;
  pVVar3[2].y = (double)local_38._8_8_;
  p_Var4 = (this->_halfedge)._M_node[1]._M_prev[2]._M_prev;
  p_Var1 = p_Var4[2]._M_prev;
  dVar2 = (this->position).z;
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = (this->position).y;
  p_Var7 = p_Var4[2]._M_next;
  pVVar5->x = (double)p_Var4[1]._M_prev - (this->position).x;
  pVVar5->y = (double)p_Var7 - dVar6;
  pVVar5->z = (double)p_Var1 - dVar2;
  dVar2 = dot(pVVar5,pVVar5 + 2);
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_28 = pVVar5[2].z * dVar2;
  dVar6 = dVar2 * pVVar5[2].y;
  local_38._8_4_ = SUB84(dVar6,0);
  local_38._0_8_ = dVar2 * pVVar5[2].x;
  local_38._12_4_ = (int)((ulong)dVar6 >> 0x20);
  Vector3D::operator-=(pVVar5,(Vector3D *)local_38);
  Vector3D::normalize((axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  pVVar5 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  cross(pVVar5 + 2,pVVar5);
  pVVar3 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3[1].z = local_28;
  pVVar3[1].x = (double)local_38._0_8_;
  pVVar3[1].y = (double)local_38._8_8_;
  return;
}

Assistant:

void Vertex::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the normal direction
    axes[2] = normal();

    // Use the first outgoing edge to pick an arbitrary X
    // direction, projecting out any component of the Z
    // direction chosen above
    Vector3D p0 = position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = p1 - p0;
    axes[0] -= dot( axes[0], axes[2] ) * axes[2];
    axes[0].normalize();

    // For the third axis, just take the cross product of
    // the first two, being careful to pick the order of the
    // cross product to satisfy the right-hand rule (i.e.,
    // so in the end we get X x Y = Z).
    axes[1] = cross( axes[2], axes[0] );
  }